

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O3

inform_pid_lattice * build_hasse(inform_pid_source **srcs,inform_error *err)

{
  inform_pid_source *piVar1;
  size_t *psVar2;
  size_t sVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong *puVar6;
  bool bVar7;
  inform_pid_lattice *piVar8;
  inform_pid_source *piVar9;
  inform_pid_source *piVar10;
  inform_pid_source **ppiVar11;
  ulong uVar12;
  inform_pid_source *piVar13;
  size_t *psVar14;
  inform_pid_source *piVar15;
  
  if ((srcs == (inform_pid_source **)0x0) || (piVar1 = srcs[-1], piVar1 == (inform_pid_source *)0x0)
     ) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EARG;
    }
LAB_00106777:
    piVar8 = (inform_pid_lattice *)0x0;
  }
  else {
    piVar8 = (inform_pid_lattice *)malloc(0x20);
    if (piVar8 == (inform_pid_lattice *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
        goto LAB_00106777;
      }
LAB_00106795:
      bVar7 = true;
    }
    else {
      piVar8->sources = (inform_pid_source **)0x0;
      piVar8->top = (inform_pid_source *)0x0;
      piVar8->bottom = (inform_pid_source *)0x0;
      if (err == (inform_error *)0x0) goto LAB_00106795;
      if (*err != INFORM_SUCCESS) goto LAB_00106777;
      bVar7 = false;
    }
    piVar9 = (inform_pid_source *)0x0;
    do {
      piVar10 = (inform_pid_source *)((long)&piVar9->name + 1);
      piVar15 = piVar10;
      if (piVar10 < piVar1) {
LAB_001067c8:
        piVar13 = srcs[(long)piVar9];
        psVar2 = srcs[(long)piVar15]->name;
        sVar3 = psVar2[-1];
        if ((long)sVar3 < 1) {
          ppiVar11 = piVar13->above;
          if (ppiVar11[-1] != (inform_pid_source *)0x0) goto LAB_0010690a;
LAB_001068bb:
          ppiVar11 = push_source(ppiVar11,srcs[(long)piVar15]);
          if (ppiVar11 != (inform_pid_source **)0x0) {
            srcs[(long)piVar9]->above = ppiVar11;
            piVar13 = srcs[(long)piVar9];
            psVar2 = &piVar13->n_above;
            *psVar2 = *psVar2 + 1;
            ppiVar11 = push_source(srcs[(long)piVar15]->below,piVar13);
            if (ppiVar11 != (inform_pid_source **)0x0) {
              srcs[(long)piVar15]->below = ppiVar11;
              srcs[(long)piVar15]->n_below = srcs[(long)piVar15]->n_below + 1;
              goto LAB_001068fc;
            }
          }
          free_all_sources(srcs);
          if (!bVar7) {
            *err = INFORM_ENOMEM;
          }
          goto LAB_00106777;
        }
        puVar4 = piVar13->name;
        if (0 < (long)puVar4[-1]) {
          psVar14 = psVar2;
          do {
            puVar6 = puVar4;
            do {
              uVar5 = *puVar6;
              uVar12 = uVar5 & *psVar14;
              if (puVar4 + puVar4[-1] <= puVar6 + 1) break;
              puVar6 = puVar6 + 1;
            } while (uVar12 != uVar5);
            psVar14 = psVar14 + 1;
          } while ((psVar14 < psVar2 + sVar3) && (uVar12 == uVar5));
          if (uVar12 == uVar5) {
            ppiVar11 = piVar13->above;
            if (ppiVar11[-1] == (inform_pid_source *)0x0) goto LAB_001068bb;
            if ((long)sVar3 < 1) goto LAB_0010690a;
            piVar13 = (inform_pid_source *)0x0;
            do {
              puVar4 = ppiVar11[(long)piVar13]->name;
              if (0 < (long)puVar4[-1]) {
                psVar14 = psVar2;
                do {
                  puVar6 = puVar4;
                  do {
                    uVar5 = *puVar6;
                    uVar12 = uVar5 & *psVar14;
                    if (puVar4 + puVar4[-1] <= puVar6 + 1) break;
                    puVar6 = puVar6 + 1;
                  } while (uVar12 != uVar5);
                  psVar14 = psVar14 + 1;
                } while ((psVar14 < psVar2 + sVar3) && (uVar12 == uVar5));
                if (uVar12 == uVar5) goto LAB_0010690a;
              }
              piVar13 = (inform_pid_source *)((long)&piVar13->name + 1);
            } while (piVar13 != ppiVar11[-1]);
            goto LAB_001068bb;
          }
        }
LAB_001068fc:
        piVar15 = (inform_pid_source *)((long)&piVar15->name + 1);
        if (piVar1 <= piVar15) goto LAB_0010690a;
        goto LAB_001067c8;
      }
LAB_0010690a:
      piVar9 = piVar10;
    } while (piVar10 != piVar1);
    piVar8->sources = srcs;
    piVar8->bottom = *srcs;
    piVar8->top = srcs[(long)((long)&piVar1[-1].pi + 7)];
    piVar8->size = (size_t)srcs[-1];
  }
  return piVar8;
}

Assistant:

static inform_pid_lattice *build_hasse(inform_pid_source **srcs,
        inform_error *err)
{
    if (!srcs)
    {
        INFORM_ERROR_RETURN(err, INFORM_EARG, NULL);
    }

    size_t const n = gvector_len(srcs);
    if (n == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_EARG, NULL);
    }

    inform_pid_lattice *lattice = inform_pid_lattice_alloc(err);
    if (FAILED(err))
    {
        return NULL;
    }

    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = i + 1; j < n; ++j)
        {
            if (below(srcs[i], srcs[j]))
            {
                bool stop = false;
                for (size_t k = 0; k < gvector_len(srcs[i]->above); ++k)
                {
                    inform_pid_source *x = srcs[i]->above[k];
                    if (below(x, srcs[j]))
                    {
                        stop = true;
                        break;
                    }
                }
                if (stop)
                {
                    break;
                }
                else
                {
                    inform_pid_source **above, **below;

                    above = push_source(srcs[i]->above, srcs[j]);
                    if (!above)
                    {
                        free_all_sources(srcs);
                        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                    }
                    srcs[i]->above = above;
                    srcs[i]->n_above++;

                    below = push_source(srcs[j]->below, srcs[i]);
                    if (!below)
                    {
                        free_all_sources(srcs);
                        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                    }
                    srcs[j]->below = below;
                    srcs[j]->n_below++;
                }
            }
        }
    }

    lattice->sources = srcs;
    lattice->bottom = srcs[0];
    lattice->top = srcs[n-1];
    lattice->size = gvector_len(lattice->sources);

    return lattice;
}